

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::EndGroup(BasicReporter *this,string *groupName,Totals *totals)

{
  ulong uVar1;
  ostream *poVar2;
  SpanInfo *in_RDX;
  string *in_RSI;
  long in_RDI;
  string *in_stack_000000d0;
  Totals *in_stack_000000d8;
  BasicReporter *in_stack_000000e0;
  SpanInfo *pSVar3;
  SpanInfo local_78;
  allocator local_39;
  string local_38 [32];
  SpanInfo *local_18;
  string *local_10;
  
  if ((*(byte *)(in_RDI + 0x70) & 1) != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      poVar2 = std::operator<<(poVar2,"[End of group: \'");
      poVar2 = std::operator<<(poVar2,local_10);
      std::operator<<(poVar2,"\'. ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"All ",&local_39);
      ReportCounts(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      poVar2 = std::operator<<(poVar2,"]\n");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      pSVar3 = &local_78;
      SpanInfo::SpanInfo(local_18);
      SpanInfo::operator=(local_18,pSVar3);
      SpanInfo::~SpanInfo((SpanInfo *)0x181b0d);
    }
  }
  return;
}

Assistant:

virtual void EndGroup( const std::string& groupName, const Totals& totals ) {
            if( m_groupSpan.emitted && !groupName.empty() ) {
                m_config.stream() << "[End of group: '" << groupName << "'. ";
                ReportCounts( totals );
                m_config.stream() << "]\n" << std::endl;
                m_groupSpan = SpanInfo();
            }
        }